

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall
asmjit::CodeHolder::copyFlattenedData
          (CodeHolder *this,void *dst,size_t dstSize,uint32_t copyOptions)

{
  void *pvVar1;
  long lVar2;
  ulong __n;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __n_00;
  Error EVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar7 = (ulong)(this->_sectionsByOrder).super_ZoneVectorBase._size;
  bVar11 = uVar7 == 0;
  if (bVar11) {
    uVar5 = 0;
  }
  else {
    pvVar1 = (this->_sectionsByOrder).super_ZoneVectorBase._data;
    lVar6 = 0;
    uVar5 = 0;
    do {
      lVar2 = *(long *)((long)pvVar1 + lVar6);
      uVar10 = *(ulong *)(lVar2 + 0x10);
      uVar8 = dstSize - uVar10;
      if ((dstSize < uVar10) || (__n = *(ulong *)(lVar2 + 0x50), uVar8 < __n)) {
        bVar4 = false;
      }
      else {
        memcpy((void *)((long)dst + uVar10),*(void **)(lVar2 + 0x48),__n);
        if (((copyOptions & 1) == 0) || (uVar3 = *(ulong *)(lVar2 + 0x18), uVar3 <= __n)) {
          __n_00 = 0;
        }
        else {
          if (uVar3 < uVar8) {
            uVar8 = uVar3;
          }
          __n_00 = uVar8 - __n;
          memset((void *)((long)((long)dst + uVar10) + __n),0,__n_00);
        }
        uVar10 = __n + uVar10 + __n_00;
        if (uVar5 <= uVar10) {
          uVar5 = uVar10;
        }
        bVar4 = true;
      }
      if (!bVar4) break;
      lVar6 = lVar6 + 8;
      bVar11 = uVar7 << 3 == lVar6;
    } while (!bVar11);
  }
  EVar9 = 2;
  if (bVar11) {
    EVar9 = 0;
    if (((copyOptions & 2) != 0) && (EVar9 = 0, uVar5 <= dstSize && dstSize - uVar5 != 0)) {
      EVar9 = 0;
      memset((void *)((long)dst + uVar5),0,dstSize - uVar5);
    }
  }
  return EVar9;
}

Assistant:

Error CodeHolder::copyFlattenedData(void* dst, size_t dstSize, uint32_t copyOptions) noexcept {
  size_t end = 0;
  for (Section* section : _sectionsByOrder) {
    if (section->offset() > dstSize)
      return DebugUtils::errored(kErrorInvalidArgument);

    size_t bufferSize = section->bufferSize();
    size_t offset = size_t(section->offset());

    if (ASMJIT_UNLIKELY(dstSize - offset < bufferSize))
      return DebugUtils::errored(kErrorInvalidArgument);

    uint8_t* dstTarget = static_cast<uint8_t*>(dst) + offset;
    size_t paddingSize = 0;
    memcpy(dstTarget, section->data(), bufferSize);

    if ((copyOptions & kCopyPadSectionBuffer) && bufferSize < section->virtualSize()) {
      paddingSize = Support::min<size_t>(dstSize - offset, size_t(section->virtualSize())) - bufferSize;
      memset(dstTarget + bufferSize, 0, paddingSize);
    }

    end = Support::max(end, offset + bufferSize + paddingSize);
  }

  if (end < dstSize && (copyOptions & kCopyPadTargetBuffer)) {
    memset(static_cast<uint8_t*>(dst) + end, 0, dstSize - end);
  }

  return kErrorOk;
}